

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalSequenceSideEffCase3(ShaderEvalContext *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  tcu local_9c [4];
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  Vec4 local_68;
  Vector<float,_4> local_58;
  Functional local_48 [16];
  Vector<int,_4> local_38;
  
  auVar1 = *(undefined1 (*) [16])ctx->in[0].m_data;
  auVar2 = auVar1._4_12_;
  local_68.m_data[3] = auVar1._0_4_;
  local_68.m_data[0] = (float)auVar2._0_4_;
  local_68.m_data[1] = (float)auVar2._4_4_;
  local_68.m_data[2] = (float)auVar2._8_4_;
  fStack_6c = ctx->in[1].m_data[0];
  fStack_70 = ctx->in[1].m_data[1];
  fStack_74 = ctx->in[1].m_data[2];
  local_78 = ctx->in[1].m_data[3];
  tcu::Vector<float,_4>::cast<int>(&local_58);
  local_88.m_data[0] = ctx->in[2].m_data[0];
  local_88.m_data[3] = ctx->in[2].m_data[1];
  local_88.m_data[2] = ctx->in[2].m_data[2];
  local_88.m_data[1] = ctx->in[2].m_data[3];
  local_98.m_data[0] = 0.0;
  local_98.m_data[1] = 0.0;
  local_98.m_data[2] = 0.0;
  local_98.m_data[3] = 0.0;
  tcu::greaterThan<float,4>(local_9c,&local_88,&local_98);
  sequenceSideEffCase3(local_48,&local_68,(IVec4 *)&local_58,(BVec4 *)local_9c);
  tcu::Vector<int,_4>::cast<float>(&local_38);
  *(undefined8 *)(ctx->color).m_data = local_38.m_data._0_8_;
  *(undefined8 *)((ctx->color).m_data + 2) = local_38.m_data._8_8_;
  return;
}

Assistant:

void evalSequenceSideEffCase3	(ShaderEvalContext& ctx) { ctx.color		= sequenceSideEffCase3(ctx.in[0].swizzle(1, 2, 3, 0), ctx.in[1].swizzle(3, 2, 1, 0).asInt(), greaterThan(ctx.in[2].swizzle(0, 3, 2, 1), Vec4(0.0f, 0.0f, 0.0f, 0.0f))).asFloat(); }